

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structured_mesh_builder.h
# Opt level: O0

void __thiscall
lf::mesh::utils::StructuredMeshBuilder::StructuredMeshBuilder
          (StructuredMeshBuilder *this,
          unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
          *mesh_factory)

{
  int iVar1;
  pointer pMVar2;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [392];
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *local_18;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *mesh_factory_local
  ;
  StructuredMeshBuilder *this_local;
  
  this->_vptr_StructuredMeshBuilder = (_func_int **)&PTR___cxa_pure_virtual_00cc7160;
  local_18 = mesh_factory;
  mesh_factory_local =
       (unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)this;
  std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::unique_ptr
            (&this->mesh_factory_,mesh_factory);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix(&this->bottom_left_corner_);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix(&this->top_right_corner_);
  this->num_of_x_cells_ = 0;
  this->num_of_y_cells_ = 0;
  pMVar2 = std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
           operator->(&this->mesh_factory_);
  iVar1 = (*pMVar2->_vptr_MeshFactory[1])();
  if (iVar1 != 2) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::operator<<(local_1a0,"TPTriagMeshBuilder can only construct meshes with DimMesh==2");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"mesh_factory_->DimMesh() == 2",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/structured_mesh_builder.h"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d0,&local_1f8,0x1d,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"false",&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/structured_mesh_builder.h"
               ,&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"",&local_291);
    lf::base::AssertionFailed(&local_240,&local_268,0x1d,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    abort();
  }
  return;
}

Assistant:

explicit StructuredMeshBuilder(
      std::unique_ptr<mesh::MeshFactory> mesh_factory)
      : mesh_factory_(std::move(mesh_factory)) {
    LF_ASSERT_MSG(
        mesh_factory_->DimMesh() == 2,
        "TPTriagMeshBuilder can only construct meshes with DimMesh==2");
  }